

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::anon_unknown_5::FindRedundantNodes::operator()(FindRedundantNodes *this,FuncCallExpr *node)

{
  __shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  const_iterator cVar2;
  __shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *__r;
  long *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&this->pureFunc->_M_h,
                 &((node->identifier).
                   super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  val);
  if (cVar2.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    p_Var1 = &((node->args).
               super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
    for (__r = &((node->args).
                 super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
        __r != p_Var1; __r = __r + 1) {
      std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ast::Expression,void>
                ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_38,__r);
      (**(code **)(*local_38 + 0x18))(local_38,this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    }
  }
  else {
    this->hasSideEffect = true;
  }
  return;
}

Assistant:

void operator()(const ast::FuncCallExpr &node) const override {
    if (pureFunc.find(node.identifier->val) != pureFunc.end()) {
      hasSideEffect = true;
      return;
    }
    for (auto &arg : node.args)
      visit(arg);
  }